

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test2::test
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type)

{
  GPUShaderFP64Test2 *this_00;
  GLuint program_id;
  bool bVar1;
  GLenum GVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  GLchar *pGVar6;
  char *msg;
  GPUShaderFP64Test2 *this_01;
  undefined8 uVar7;
  programInfo program_info;
  undefined1 local_1b0 [384];
  long lVar5;
  
  GVar2 = getDrawPrimitiveType(this,shader_stage);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  uVar7 = 0x400;
  if (shader_stage == FRAGMENT_SHADER) {
    uVar7 = 4;
  }
  program_info.m_context = (this->super_TestCase).m_context;
  program_info.m_compute_shader_id = 0;
  program_info.m_fragment_shader_id = 0;
  program_info.m_geometry_shader_id = 0;
  program_info.m_program_object_id = 0;
  program_info.m_tesselation_control_shader_id = 0;
  program_info.m_tesselation_evaluation_shader_id = 0;
  program_info.m_vertex_shader_id = 0;
  prepareProgram(this,shader_stage,uniform_type,&program_info);
  program_id = program_info.m_program_object_id;
  (**(code **)(lVar5 + 0x1680))(program_info.m_program_object_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x10bf);
  prepareUniforms(this,shader_stage,uniform_type,&program_info);
  testBegin(this,program_id,shader_stage);
  if (shader_stage == COMPUTE_SHADER) {
    (*this->m_pDispatchCompute)(0x20,0x20,1);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x10cb;
    msg = "DispatchCompute";
  }
  else {
    (**(code **)(lVar5 + 0x538))(GVar2,0,uVar7);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x10d0;
    msg = "DrawArrays";
  }
  glu::checkError(dVar4,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,iVar3);
  testEnd(this,shader_stage);
  bVar1 = verifyResults(this,shader_stage);
  if (!bVar1) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (GPUShaderFP64Test2 *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    this_01 = this_00;
    std::operator<<((ostream *)this_00,"Shader stage: ");
    pGVar6 = getShaderStageName(this_01,shader_stage);
    std::operator<<((ostream *)this_00,pGVar6);
    std::operator<<((ostream *)this_00,". Uniform type: ");
    std::operator<<((ostream *)this_00,(string *)&uniform_type->m_type_name);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  Utils::programInfo::~programInfo(&program_info);
  return bVar1;
}

Assistant:

bool GPUShaderFP64Test2::test(shaderStage shader_stage, const uniformTypeDetails& uniform_type) const
{
	const glw::GLenum		draw_primitive = getDrawPrimitiveType(shader_stage);
	static const glw::GLint first_vertex   = 0;
	const glw::Functions&   gl			   = m_context.getRenderContext().getFunctions();
	const glw::GLsizei		n_vertices	 = (FRAGMENT_SHADER == shader_stage) ? 4 : m_n_captured_results;
	Utils::programInfo		program_info(m_context);
	bool					result = true;

	/* Prepare program */
	prepareProgram(shader_stage, uniform_type, program_info);

	gl.useProgram(program_info.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	/* Prepare uniform buffer and bind it with uniform block */
	prepareUniforms(shader_stage, uniform_type, program_info);

	/* Prepare storage for test results */
	testBegin(program_info.m_program_object_id, shader_stage);

	/* Execute */
	if (COMPUTE_SHADER == shader_stage)
	{
		m_pDispatchCompute(m_texture_width, m_texture_height, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");
	}
	else
	{
		gl.drawArrays(draw_primitive, first_vertex, n_vertices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");
	}

	/* Clean after test */
	testEnd(shader_stage);

	/* Check results */
	if (false == verifyResults(shader_stage))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Shader stage: " << getShaderStageName(shader_stage)
			<< ". Uniform type: " << uniform_type.m_type_name << tcu::TestLog::EndMessage;

		result = false;
	}

	return result;
}